

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

AsinhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_asinh(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x302) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x302;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    AsinhLayerParams::AsinhLayerParams(this_00.asinh_);
    (this->layer_).asinh_ = (AsinhLayerParams *)this_00;
  }
  return (AsinhLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::AsinhLayerParams* NeuralNetworkLayer::mutable_asinh() {
  if (!has_asinh()) {
    clear_layer();
    set_has_asinh();
    layer_.asinh_ = new ::CoreML::Specification::AsinhLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.asinh)
  return layer_.asinh_;
}